

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O3

void __thiscall ipx::ForrestTomlin::_BtranForUpdate(ForrestTomlin *this,Int j,IndexedVector *lhs)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  double *pdVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  double *pdVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  
  ComputeEta(this,j);
  piVar5 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (uint)((ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2);
  if (0 < (int)uVar12) {
    iVar2 = this->dim_;
    pdVar6 = (this->work_)._M_data;
    piVar7 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->R_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->R_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (ulong)(uVar12 & 0x7fffffff);
    do {
      uVar1 = uVar13 - 1;
      dVar15 = pdVar6[(long)iVar2 + (uVar13 - 1)];
      iVar3 = piVar7[uVar13 - 1];
      lVar14 = (long)iVar3;
      iVar4 = piVar7[uVar13];
      if (iVar3 < iVar4) {
        do {
          iVar3 = piVar8[lVar14];
          pdVar6[iVar3] = pdVar9[lVar14] * -dVar15 + pdVar6[iVar3];
          lVar14 = lVar14 + 1;
        } while (iVar4 != lVar14);
        dVar15 = pdVar6[(long)iVar2 + uVar1];
      }
      pdVar6[piVar5[uVar1]] = dVar15;
      pdVar6[(long)iVar2 + uVar1] = 0.0;
      bVar11 = 1 < (long)uVar13;
      uVar13 = uVar1;
    } while (bVar11);
  }
  TriangularSolve(&this->L_,&this->work_,'t',"lower",1);
  iVar2 = this->dim_;
  if (0 < (long)iVar2) {
    pdVar6 = (this->work_)._M_data;
    piVar5 = (this->rowperm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (lhs->elements_)._M_data;
    lVar14 = 0;
    do {
      pdVar10[piVar5[lVar14]] = pdVar6[lVar14];
      lVar14 = lVar14 + 1;
    } while (iVar2 != lVar14);
  }
  lhs->nnz_ = -1;
  return;
}

Assistant:

void ForrestTomlin::_BtranForUpdate(Int j, IndexedVector& lhs) {
    ComputeEta(j);

    // Apply update etas and solve with L'.
    Int num_updates = replaced_.size();
    for (Int k = num_updates-1; k >= 0; k--) {
        ScatterColumn(R_, k, -work_[dim_+k], work_);
        work_[replaced_[k]] = work_[dim_+k];
        work_[dim_+k] = 0.0;
    }
    TriangularSolve(L_, work_, 't', "lower", 1);

    // Return lhs without pattern.
    for (Int p = 0; p < dim_; p++)
        lhs[rowperm_[p]] = work_[p];
    lhs.InvalidatePattern();
}